

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kmip.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Kmip::readRole
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Kmip *this,Path *scope,Path *role)

{
  Client *client;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  Url local_48;
  Path *local_28;
  Path *role_local;
  Path *scope_local;
  Kmip *this_local;
  
  client = *(Client **)this;
  local_28 = role;
  role_local = scope;
  scope_local = (Path *)this;
  this_local = (Kmip *)__return_storage_ptr__;
  Vault::operator+(&local_c8,"scope/",scope);
  std::operator+(&local_a8,&local_c8,"/role/");
  Vault::operator+(&local_88,&local_a8,local_28);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_68,&local_88);
  getUrl(&local_48,this,&local_68);
  HttpConsumer::get(__return_storage_ptr__,client,&local_48);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_48);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Kmip::readRole(const Path &scope,
                                                 const Path &role) {
  return HttpConsumer::get(client_,
                           getUrl(Path{"scope/" + scope + "/role/" + role}));
}